

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetKey(GLFWwindow *handle,int key)

{
  _GLFWwindow *window;
  int key_local;
  GLFWwindow *handle_local;
  
  if (handle != (GLFWwindow *)0x0) {
    if (_glfw.initialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      handle_local._4_4_ = 0;
    }
    else if ((key < 0x20) || (0x15c < key)) {
      _glfwInputError(0x10003,"Invalid key %i",(ulong)(uint)key);
      handle_local._4_4_ = 0;
    }
    else if (handle[(long)key + 0x80] == (GLFWwindow)0x3) {
      handle[(long)key + 0x80] = (GLFWwindow)0x0;
      handle_local._4_4_ = 1;
    }
    else {
      handle_local._4_4_ = (int)(char)handle[(long)key + 0x80];
    }
    return handle_local._4_4_;
  }
  __assert_fail("window != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/src/input.c"
                ,0x278,"int glfwGetKey(GLFWwindow *, int)");
}

Assistant:

GLFWAPI int glfwGetKey(GLFWwindow* handle, int key)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (key < GLFW_KEY_SPACE || key > GLFW_KEY_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid key %i", key);
        return GLFW_RELEASE;
    }

    if (window->keys[key] == _GLFW_STICK)
    {
        // Sticky mode: release key now
        window->keys[key] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->keys[key];
}